

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeWorkItem.cpp
# Opt level: O2

uint __thiscall JITTimeWorkItem::GetLoopNumber(JITTimeWorkItem *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  CodeGenWorkItemIDL *pCVar4;
  
  pCVar4 = this->m_workItemData;
  if ((pCVar4->type != '\x01') && (pCVar4->loopNumber != 0xffffffff)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                       ,0x1f,
                       "(IsLoopBody() || m_workItemData->loopNumber == Js::LoopHeader::NoLoop)",
                       "IsLoopBody() || m_workItemData->loopNumber == Js::LoopHeader::NoLoop");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pCVar4 = this->m_workItemData;
  }
  return pCVar4->loopNumber;
}

Assistant:

uint
JITTimeWorkItem::GetLoopNumber() const
{
    Assert(IsLoopBody() || m_workItemData->loopNumber == Js::LoopHeader::NoLoop);
    return m_workItemData->loopNumber;
}